

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gga_x_lsrpbe.c
# Opt level: O2

void lsrpbe_set_ext_params(xc_func_type *p,double *ext_params)

{
  double *pdVar1;
  
  pdVar1 = (double *)p->params;
  set_ext_params_cpy(p,ext_params);
  pdVar1[1] = (*pdVar1 + 1.0) * pdVar1[2] + pdVar1[1];
  return;
}

Assistant:

static void
lsrpbe_set_ext_params(xc_func_type *p, const double *ext_params)
{
  gga_x_lsrpbe_params *params;

  assert(p != NULL && p->params != NULL);
  params = (gga_x_lsrpbe_params *) (p->params);

  set_ext_params_cpy(p, ext_params);

  /* adapt used mu value to yield wanted mu near origin (eq 9) */
  params-> mu += params->alpha*(1.0 + params->kappa);
}